

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::read_in_particle_samples_Sangwook(particleSamples *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  void *pvVar3;
  istream *piVar4;
  string *type;
  istream *piVar5;
  long in_RDI;
  particle_info temp_particle_info;
  stringstream temp2;
  int ipart;
  stringstream temp1;
  int num_particles;
  double temp_mass;
  int urqmd_charge;
  int urqmd_iso3;
  int urqmd_pid;
  int ievent;
  int parent_proc_type;
  double dummy;
  int n_particle;
  string temp_string;
  char (*in_stack_fffffffffffff998) [22];
  allocator *in_stack_fffffffffffff9a0;
  value_type *in_stack_fffffffffffff9a8;
  allocator *in_stack_fffffffffffff9b0;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_fffffffffffff9b8;
  particleSamples *in_stack_fffffffffffff9c0;
  pretty_ostream *in_stack_fffffffffffffa38;
  particleSamples *in_stack_fffffffffffffa40;
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [32];
  int local_408;
  double local_400;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8 [5];
  stringstream local_390 [396];
  int local_204;
  stringstream local_200 [392];
  void *local_78;
  int local_5c;
  double local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  int local_2c;
  string local_28 [40];
  
  clear_out_previous_record(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  std::__cxx11::string::string(local_28);
  local_40 = 0;
  local_5c = 0;
  while (local_5c < *(int *)(in_RDI + 0x5f0)) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(in_RDI + 0x1c8),local_28);
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) != 0) break;
    pvVar3 = operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x146063);
    local_78 = pvVar3;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_200,local_28,_Var2);
    std::istream::operator>>((istream *)local_200,&local_2c);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(in_RDI + 0x1c8),local_28);
    for (local_204 = 0; local_204 < local_2c; local_204 = local_204 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)(in_RDI + 0x1c8),local_28);
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_390,local_28,_Var2);
      piVar4 = (istream *)std::istream::operator>>((istream *)local_390,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_58);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_44);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_48);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_4c);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      std::istream::operator>>(piVar4,&local_3c);
      type = (string *)std::istream::operator>>((istream *)local_390,local_3b8);
      piVar5 = (istream *)std::istream::operator>>((istream *)type,&local_3d0);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3c8);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3c0);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3d8);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3f0);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3e8);
      std::istream::operator>>(piVar5,&local_3e0);
      local_400 = local_58;
      local_408 = get_pdg_id(in_stack_fffffffffffffa40,
                             (int)((ulong)in_stack_fffffffffffffa38 >> 0x20),
                             (int)in_stack_fffffffffffffa38);
      if (local_408 == 0) {
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [7])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_428,"error",&local_429);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_428);
        std::allocator<char>::~allocator((allocator<char> *)&local_429);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [14])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [11])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(int *)in_stack_fffffffffffff998);
        in_stack_fffffffffffffa40 = (particleSamples *)(in_RDI + 0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_450,"error",&local_451);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_450);
        std::allocator<char>::~allocator((allocator<char> *)&local_451);
        in_stack_fffffffffffffa38 =
             pretty_ostream::operator<<
                       ((pretty_ostream *)in_stack_fffffffffffff9a0,
                        (char (*) [8])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [7])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [8])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [8])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [8])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [7])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [7])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [7])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,
                   (char (*) [7])in_stack_fffffffffffff998);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        in_stack_fffffffffffff9a8 = (value_type *)(in_RDI + 0x30);
        in_stack_fffffffffffff9b0 = &local_479;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_478,"error",in_stack_fffffffffffff9b0);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_478);
        std::allocator<char>::~allocator((allocator<char> *)&local_479);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
        in_stack_fffffffffffff998 = (char (*) [22])(in_RDI + 0x30);
        in_stack_fffffffffffff9a0 = &local_4a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4a0,"error",in_stack_fffffffffffff9a0);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_4a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      }
      else {
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       **)(in_RDI + 0x690),(long)local_40);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((vector<particle_info,_std::allocator<particle_info>_> *)
                   in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      }
      std::__cxx11::stringstream::~stringstream(local_390);
    }
    local_5c = local_2c + local_5c;
    local_40 = local_40 + 1;
    std::__cxx11::stringstream::~stringstream(local_200);
  }
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_Sangwook() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int n_particle;
    double dummy;
    int parent_proc_type;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3, urqmd_charge;
    double temp_mass;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        getline(inputfile, temp_string);

        if (inputfile.eof()) break;

        // create one event
        full_particle_list->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;
        getline(inputfile, temp_string);  // then get one useless line

        for (int ipart = 0; ipart < n_particle; ipart++) {
            getline(inputfile, temp_string);
            std::stringstream temp2(temp_string);
            temp2 >> dummy >> dummy >> dummy >> dummy >> dummy >> dummy >> dummy
                >> dummy >> temp_mass >> urqmd_pid >> urqmd_iso3 >> urqmd_charge
                >> dummy >> dummy >> parent_proc_type;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.t >> temp_particle_info.x
                >> temp_particle_info.y >> temp_particle_info.z
                >> temp_particle_info.E >> temp_particle_info.px
                >> temp_particle_info.py >> temp_particle_info.pz;
            temp_particle_info.mass = temp_mass;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list)[ievent]->push_back(temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}